

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

uint64_t atol10(char *p,size_t char_cnt)

{
  uint64_t uVar1;
  size_t sVar2;
  
  if (char_cnt == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    for (sVar2 = 0; ((int)p[sVar2] - 0x30U < 10 && (char_cnt != sVar2)); sVar2 = sVar2 + 1) {
      uVar1 = (ulong)((int)p[sVar2] - 0x30U) + uVar1 * 10;
    }
  }
  return uVar1;
}

Assistant:

static uint64_t
atol10(const char *p, size_t char_cnt)
{
	uint64_t l;
	int digit;

	if (char_cnt == 0)
		return (0);

	l = 0;
	digit = *p - '0';
	while (digit >= 0 && digit < 10  && char_cnt-- > 0) {
		l = (l * 10) + digit;
		digit = *++p - '0';
	}
	return (l);
}